

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O1

void __thiscall FResourceLump::~FResourceLump(FResourceLump *this)

{
  this->_vptr_FResourceLump = (_func_int **)&PTR__FResourceLump_00864d50;
  if ((this->Cache != (char *)0x0) && (-1 < this->RefCount)) {
    operator_delete__(this->Cache);
    this->Cache = (char *)0x0;
  }
  this->Owner = (FResourceFile *)0x0;
  FString::~FString(&this->FullName);
  return;
}

Assistant:

FResourceLump::~FResourceLump()
{
	if (Cache != NULL && RefCount >= 0)
	{
		delete [] Cache;
		Cache = NULL;
	}
	Owner = NULL;
}